

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_ori_16_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint value;
  
  uVar1 = m68ki_read_imm_16();
  uVar2 = m68ki_read_imm_16();
  uVar3 = m68ki_read_16_fc((int)(short)uVar2,m68ki_address_space | m68ki_cpu.s_flag);
  value = (uVar3 | uVar1) & 0xffff;
  m68ki_write_16_fc((int)(short)uVar2,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value >> 8;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_ori_16_aw(void)
{
	uint src = OPER_I_16();
	uint ea = EA_AW_16();
	uint res = MASK_OUT_ABOVE_16(src | m68ki_read_16(ea));

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}